

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,REF_BOOL *all_done)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  REF_STATUS RVar5;
  uint uVar6;
  double dVar7;
  double local_348;
  double local_340;
  REF_INT *local_338;
  REF_INT *local_330;
  double local_328;
  REF_DBL local_320;
  REF_DBL local_318;
  double local_310;
  REF_DBL local_308;
  REF_DBL local_300;
  double local_2f8;
  REF_INT *local_2f0;
  REF_DBL local_2e8;
  REF_DBL local_2e0;
  uint local_2d8;
  uint local_2d4;
  double local_2d0;
  double local_2c8;
  double local_2b8;
  REF_DBL local_2b0;
  REF_DBL local_2a8;
  REF_DBL local_2a0;
  REF_DBL local_298;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_DBL normal_projection;
  REF_DBL normal [3];
  double local_1e8;
  REF_DBL area;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL mixed;
  REF_INT local_mixed;
  REF_INT int_mixed;
  REF_DBL m [6];
  REF_EDGE local_180;
  REF_EDGE ref_edge;
  REF_INT max_age;
  REF_INT age;
  REF_INT part;
  REF_INT edge;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL ratio;
  REF_INT max_degree;
  REF_INT degree;
  REF_DBL nodes_per_complexity;
  int local_138;
  REF_INT nnode;
  REF_INT node;
  REF_INT cell_node;
  REF_DBL target_normdev;
  REF_DBL target_quality;
  REF_DBL max_volume;
  REF_DBL min_volume;
  REF_DBL volume;
  REF_DBL min_normdev;
  REF_DBL normdev;
  REF_DBL min_quality;
  REF_DBL quality;
  REF_DBL min_metric_vol;
  REF_DBL complexity;
  REF_DBL max_det;
  REF_DBL det;
  REF_INT nodes [27];
  long local_50;
  REF_LONG ncell;
  REF_CELL pRStack_40;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_ADAPT ref_adapt;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_BOOL *all_done_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  ref_adapt = (REF_ADAPT)ref_grid->node;
  ref_cell = (REF_CELL)ref_grid->adapt;
  mixed = 0;
  if ((((0 < ref_grid->cell[6]->n) || (0 < ref_grid->cell[9]->n)) || (0 < ref_grid->cell[10]->n)) ||
     (0 < ref_grid->cell[0xb]->n)) {
    mixed = 1;
  }
  ref_private_macro_code_rss = mixed;
  ref_mpi = (REF_MPI)all_done;
  all_done_local = (REF_BOOL *)ref_grid;
  ref_private_macro_code_rss_2 = ref_mpi_max((REF_MPI)ref_node,&ref_private_macro_code_rss,&mixed,1)
  ;
  if (ref_private_macro_code_rss_2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x9d,
           "ref_adapt_parameter",(ulong)(uint)ref_private_macro_code_rss_2,"mpi max");
    return ref_private_macro_code_rss_2;
  }
  ref_private_macro_code_rss_1 = (REF_STATUS)(0 < mixed);
  if ((all_done_local[0x42] == 0) && (all_done_local[0x43] == 0)) {
    pRStack_40 = *(REF_CELL *)(all_done_local + 0x14);
  }
  else {
    pRStack_40 = *(REF_CELL *)(all_done_local + 10);
  }
  normdev = 1.0;
  max_volume = 1e+200;
  target_quality = -1e+200;
  complexity = -1.0;
  min_metric_vol = 0.0;
  local_50 = 0;
  ref_private_macro_code_rss_2 = 0;
  for (ncell._4_4_ = 0; ncell._4_4_ < pRStack_40->max; ncell._4_4_ = ncell._4_4_ + 1) {
    RVar5 = ref_cell_nodes(pRStack_40,ncell._4_4_,(REF_INT *)&det);
    if (RVar5 == 0) {
      if ((all_done_local[0x42] == 0) && (all_done_local[0x43] == 0)) {
        ref_private_macro_code_rss_5 =
             ref_node_tet_quality(*(REF_NODE *)(all_done_local + 2),(REF_INT *)&det,&min_quality);
        if (ref_private_macro_code_rss_5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0xb3,"ref_adapt_parameter",(ulong)(uint)ref_private_macro_code_rss_5,"qual");
          return ref_private_macro_code_rss_5;
        }
        ref_private_macro_code_rss_6 =
             ref_node_tet_vol(*(REF_NODE *)(all_done_local + 2),(REF_INT *)&det,&min_volume);
        if (ref_private_macro_code_rss_6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0xb4,"ref_adapt_parameter",(ulong)(uint)ref_private_macro_code_rss_6,"vol");
          return ref_private_macro_code_rss_6;
        }
        ref_private_macro_code_rss_6 = 0;
      }
      else {
        ref_private_macro_code_rss_3 =
             ref_node_tri_quality(*(REF_NODE *)(all_done_local + 2),(REF_INT *)&det,&min_quality);
        if (ref_private_macro_code_rss_3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0xaf,"ref_adapt_parameter",(ulong)(uint)ref_private_macro_code_rss_3,"qual");
          return ref_private_macro_code_rss_3;
        }
        ref_private_macro_code_rss_4 =
             ref_node_tri_area(*(REF_NODE *)(all_done_local + 2),(REF_INT *)&det,&min_volume);
        if (ref_private_macro_code_rss_4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0xb0,"ref_adapt_parameter",(ulong)(uint)ref_private_macro_code_rss_4,"vol");
          return ref_private_macro_code_rss_4;
        }
        ref_private_macro_code_rss_4 = 0;
      }
      if (min_quality <= normdev) {
        local_298 = min_quality;
      }
      else {
        local_298 = normdev;
      }
      normdev = local_298;
      if (min_volume <= max_volume) {
        local_2a0 = min_volume;
      }
      else {
        local_2a0 = max_volume;
      }
      max_volume = local_2a0;
      if (target_quality <= min_volume) {
        local_2a8 = min_volume;
      }
      else {
        local_2a8 = target_quality;
      }
      target_quality = local_2a8;
      for (nnode = 0; nnode < pRStack_40->node_per; nnode = nnode + 1) {
        if (*(int *)((long)ref_adapt->post_min_normdev + 4) ==
            *(int *)((long)ref_adapt->collapse_quality_absolute + (long)nodes[(long)nnode + -2] * 4)
           ) {
          area._4_4_ = ref_node_metric_get((REF_NODE)ref_adapt,nodes[(long)nnode + -2],
                                           (REF_DBL *)&local_mixed);
          if (area._4_4_ != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0xbc,"ref_adapt_parameter",(ulong)area._4_4_,"get");
            return area._4_4_;
          }
          area._0_4_ = ref_matrix_det_m((REF_DBL *)&local_mixed,&max_det);
          if (area._0_4_ != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0xbd,"ref_adapt_parameter",(ulong)area._0_4_,"det");
            return area._0_4_;
          }
          if (complexity <= max_det) {
            local_2b0 = max_det;
          }
          else {
            local_2b0 = complexity;
          }
          complexity = local_2b0;
          if (all_done_local[0x43] == 0) {
            if (0.0 < max_det) {
              dVar7 = sqrt(max_det);
              min_metric_vol = (dVar7 * min_volume) / (double)pRStack_40->node_per + min_metric_vol;
            }
          }
          else {
            uVar6 = ref_node_tri_area(*(REF_NODE *)(all_done_local + 2),(REF_INT *)&det,&local_1e8);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0xc1,"ref_adapt_parameter",(ulong)uVar6,"vol");
              return uVar6;
            }
            uVar6 = ref_node_tri_normal(*(REF_NODE *)(all_done_local + 2),(REF_INT *)&det,
                                        &normal_projection);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0xc3,"ref_adapt_parameter",(ulong)uVar6,"norm");
              return uVar6;
            }
            RVar5 = ref_math_normalize(&normal_projection);
            if (RVar5 == 0) {
              dVar7 = normal[1] * (m[4] * normal[1] + m[1] * normal_projection + m[3] * normal[0]) +
                      normal_projection *
                      (m[1] * normal[1] + _local_mixed * normal_projection + m[0] * normal[0]) +
                      normal[0] * (m[3] * normal[1] + m[0] * normal_projection + m[2] * normal[0]);
              if (dVar7 * 1e+20 <= 0.0) {
                local_2b8 = -(dVar7 * 1e+20);
              }
              else {
                local_2b8 = dVar7 * 1e+20;
              }
              if (max_det <= 0.0) {
                local_2c8 = -max_det;
              }
              else {
                local_2c8 = max_det;
              }
              if ((local_2c8 < local_2b8) && (0.0 < max_det / dVar7)) {
                dVar7 = sqrt(max_det / dVar7);
                min_metric_vol = (dVar7 * local_1e8) / (double)pRStack_40->node_per + min_metric_vol
                ;
              }
            }
          }
        }
      }
      uVar6 = ref_cell_part(pRStack_40,(REF_NODE)ref_adapt,ncell._4_4_,&max_age);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0xd6,"ref_adapt_parameter",(ulong)uVar6,"owner");
        return uVar6;
      }
      if (max_age == ref_node->max) {
        local_50 = local_50 + 1;
      }
    }
  }
  min_quality = normdev;
  uVar6 = ref_mpi_min((REF_MPI)ref_node,&min_quality,&normdev,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xda,
           "ref_adapt_parameter",(ulong)uVar6,"mpi min");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&min_quality,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xdb,
           "ref_adapt_parameter",(ulong)uVar6,"mbast");
    return uVar6;
  }
  min_volume = max_volume;
  uVar6 = ref_mpi_min((REF_MPI)ref_node,&min_volume,&max_volume,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xdd,
           "ref_adapt_parameter",(ulong)uVar6,"mpi min");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&max_volume,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xde,
           "ref_adapt_parameter",(ulong)uVar6,"bcast");
    return uVar6;
  }
  min_volume = target_quality;
  uVar6 = ref_mpi_max((REF_MPI)ref_node,&min_volume,&target_quality,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe0,
           "ref_adapt_parameter",(ulong)uVar6,"mpi max");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&target_quality,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe1,
           "ref_adapt_parameter",(ulong)uVar6,"bcast");
    return uVar6;
  }
  max_det = complexity;
  uVar6 = ref_mpi_max((REF_MPI)ref_node,&max_det,&complexity,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe3,
           "ref_adapt_parameter",(ulong)uVar6,"mpi max");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&complexity,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe4,
           "ref_adapt_parameter",(ulong)uVar6,"bcast");
    return uVar6;
  }
  dVar7 = sqrt(complexity);
  if (dVar7 * 1e+20 <= 0.0) {
    dVar7 = sqrt(complexity);
    local_2d0 = -(dVar7 * 1e+20);
  }
  else {
    local_2d0 = sqrt(complexity);
    local_2d0 = local_2d0 * 1e+20;
  }
  if (local_2d0 <= 1.0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe5,
           "ref_adapt_parameter","can not invert sqrt(max_det)");
    return 1;
  }
  dVar7 = sqrt(complexity);
  quality = 1.0 / dVar7;
  uVar6 = ref_mpi_allsum((REF_MPI)ref_node,&min_metric_vol,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe8,
           "ref_adapt_parameter",(ulong)uVar6,"dbl sum");
    return uVar6;
  }
  uVar6 = ref_mpi_allsum((REF_MPI)ref_node,&local_50,1,2);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe9,
           "ref_adapt_parameter",(ulong)uVar6,"cell int sum");
    return uVar6;
  }
  nodes_per_complexity._4_4_ = 0;
  for (local_138 = 0; local_138 < *(int *)&ref_adapt->field_0x4; local_138 = local_138 + 1) {
    if ((((-1 < local_138) && (local_138 < *(int *)&ref_adapt->field_0x4)) &&
        (-1 < *(long *)((long)ref_adapt->split_quality_absolute + (long)local_138 * 8))) &&
       (*(int *)((long)ref_adapt->post_min_normdev + 4) ==
        *(int *)((long)ref_adapt->collapse_quality_absolute + (long)local_138 * 4))) {
      nodes_per_complexity._4_4_ = nodes_per_complexity._4_4_ + 1;
    }
  }
  uVar6 = ref_mpi_allsum((REF_MPI)ref_node,(void *)((long)&nodes_per_complexity + 4),1,1);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xf1,
           "ref_adapt_parameter",(ulong)uVar6,"int sum");
    return uVar6;
  }
  _max_degree = (double)(int)nodes_per_complexity._4_4_ / min_metric_vol;
  ratio._0_4_ = 0;
  for (local_138 = 0; local_138 < *(int *)&ref_adapt->field_0x4; local_138 = local_138 + 1) {
    if (((-1 < local_138) && (local_138 < *(int *)&ref_adapt->field_0x4)) &&
       (-1 < *(long *)((long)ref_adapt->split_quality_absolute + (long)local_138 * 8))) {
      uVar6 = ref_adj_degree(pRStack_40->ref_adj,local_138,(REF_INT *)((long)&ratio + 4));
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0xf7,"ref_adapt_parameter",(ulong)uVar6,"cell degree");
        return uVar6;
      }
      if ((int)ratio._4_4_ < (int)ratio._0_4_) {
        local_2d4 = ratio._0_4_;
      }
      else {
        local_2d4 = ratio._4_4_;
      }
      ratio._0_4_ = local_2d4;
    }
  }
  ratio._4_4_ = ratio._0_4_;
  uVar6 = ref_mpi_max((REF_MPI)ref_node,(void *)((long)&ratio + 4),&ratio,1);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xfb,
           "ref_adapt_parameter",(ulong)uVar6,"mpi max");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&ratio,1,1);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xfc,
           "ref_adapt_parameter",(ulong)uVar6,"min");
    return uVar6;
  }
  ref_edge._0_4_ = 0;
  for (local_138 = 0; local_138 < *(int *)&ref_adapt->field_0x4; local_138 = local_138 + 1) {
    if (((-1 < local_138) && (local_138 < *(int *)&ref_adapt->field_0x4)) &&
       (-1 < *(long *)((long)ref_adapt->split_quality_absolute + (long)local_138 * 8))) {
      if (*(int *)((long)ref_adapt->smooth_min_quality + (long)local_138 * 4) < (int)(uint)ref_edge)
      {
        local_2d8 = (uint)ref_edge;
      }
      else {
        local_2d8 = *(uint *)((long)ref_adapt->smooth_min_quality + (long)local_138 * 4);
      }
      ref_edge._0_4_ = local_2d8;
    }
  }
  ref_edge._4_4_ = (uint)ref_edge;
  uVar6 = ref_mpi_max((REF_MPI)ref_node,(void *)((long)&ref_edge + 4),&ref_edge,1);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x103,
           "ref_adapt_parameter",(ulong)uVar6,"mpi max");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&ref_edge,1,1);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x104,
           "ref_adapt_parameter",(ulong)uVar6,"min");
    return uVar6;
  }
  volume = 2.0;
  if ((*(long *)(*(long *)(all_done_local + 0x26) + 0x90) != 0) ||
     (*(long *)(*(long *)(all_done_local + 0x26) + 0xd8) != 0)) {
    pRStack_40 = *(REF_CELL *)(all_done_local + 10);
    for (ncell._4_4_ = 0; ncell._4_4_ < pRStack_40->max; ncell._4_4_ = ncell._4_4_ + 1) {
      RVar5 = ref_cell_nodes(pRStack_40,ncell._4_4_,(REF_INT *)&det);
      if (RVar5 == 0) {
        uVar6 = ref_geom_tri_norm_deviation
                          ((REF_GRID_conflict)all_done_local,(REF_INT *)&det,&min_normdev);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x10b,"ref_adapt_parameter",(ulong)uVar6,"norm dev");
          return uVar6;
        }
        if (min_normdev <= volume) {
          local_2e0 = min_normdev;
        }
        else {
          local_2e0 = volume;
        }
        volume = local_2e0;
      }
    }
  }
  min_normdev = volume;
  uVar6 = ref_mpi_min((REF_MPI)ref_node,&min_normdev,&volume,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x110,
           "ref_adapt_parameter",(ulong)uVar6,"mpi max");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&volume,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x111,
           "ref_adapt_parameter",(ulong)uVar6,"min");
    return uVar6;
  }
  max_ratio = 1e+200;
  _part = (REF_INT *)0xe974e718d7d7625a;
  uVar6 = ref_edge_create(&local_180,(REF_GRID)all_done_local);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x115,
           "ref_adapt_parameter",(ulong)uVar6,"make edges");
    return uVar6;
  }
  for (age = 0; age < local_180->n; age = age + 1) {
    uVar6 = ref_edge_part(local_180,age,&max_age);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x117
             ,"ref_adapt_parameter",(ulong)uVar6,"edge part");
      return uVar6;
    }
    if (max_age == *(int *)(*(long *)all_done_local + 4)) {
      uVar6 = ref_node_ratio(*(REF_NODE *)(all_done_local + 2),local_180->e2n[age << 1],
                             local_180->e2n[age * 2 + 1],&min_ratio);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x11c,"ref_adapt_parameter",(ulong)uVar6,"rat");
        return uVar6;
      }
      if (min_ratio <= max_ratio) {
        local_2e8 = min_ratio;
      }
      else {
        local_2e8 = max_ratio;
      }
      max_ratio = local_2e8;
      if ((double)_part <= min_ratio) {
        local_2f0 = (REF_INT *)min_ratio;
      }
      else {
        local_2f0 = _part;
      }
      _part = local_2f0;
    }
  }
  uVar6 = ref_edge_free(local_180);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x121,
           "ref_adapt_parameter",(ulong)uVar6,"free edge");
    return uVar6;
  }
  min_ratio = max_ratio;
  uVar6 = ref_mpi_min((REF_MPI)ref_node,&min_ratio,&max_ratio,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x123,
           "ref_adapt_parameter",(ulong)uVar6,"mpi min");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&max_ratio,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x124,
           "ref_adapt_parameter",(ulong)uVar6,"min");
    return uVar6;
  }
  min_ratio = (REF_DBL)_part;
  uVar6 = ref_mpi_max((REF_MPI)ref_node,&min_ratio,&part,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x126,
           "ref_adapt_parameter",(ulong)uVar6,"mpi max");
    return uVar6;
  }
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,&part,1,3);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x127,
           "ref_adapt_parameter",(ulong)uVar6,"max");
    return uVar6;
  }
  if (volume <= 0.1) {
    local_2f8 = volume;
  }
  else {
    local_2f8 = 0.1;
  }
  if (local_2f8 <= 0.001) {
    local_308 = 0.001;
  }
  else {
    if (volume <= 0.1) {
      local_300 = volume;
    }
    else {
      local_300 = 0.1;
    }
    local_308 = local_300;
  }
  _node = local_308;
  *(REF_DBL *)&ref_cell[1].size_per = local_308;
  if (normdev <= 0.1) {
    local_310 = normdev;
  }
  else {
    local_310 = 0.1;
  }
  if (local_310 <= 0.001) {
    local_320 = 0.001;
  }
  else {
    if (normdev <= 0.1) {
      local_318 = normdev;
    }
    else {
      local_318 = 0.1;
    }
    local_320 = local_318;
  }
  target_normdev = local_320;
  *(REF_DBL *)&ref_cell->n = local_320;
  *(REF_DBL *)&ref_cell->blank = local_320;
  if (quality * 0.01 <= 1e-15) {
    local_328 = quality * 0.01;
  }
  else {
    local_328 = 1e-15;
  }
  *(double *)&ref_adapt->unlock_tet = local_328;
  ref_cell->type = REF_CELL_EDG;
  if (*(long *)(all_done_local + 0x2c) != 0) {
    ref_cell->type = *(REF_CELL_TYPE *)(*(long *)(all_done_local + 0x2c) + 0x34);
  }
  if ((double)ref_cell->f2n <= max_ratio) {
    local_330 = ref_cell->f2n;
  }
  else {
    local_330 = (REF_INT *)max_ratio;
  }
  *(REF_INT **)&ref_cell[1].edge_per = local_330;
  if ((double)_part < *(double *)&ref_cell->size_per ||
      (double)_part == *(double *)&ref_cell->size_per) {
    local_338 = *(REF_INT **)&ref_cell->size_per;
  }
  else {
    local_338 = _part;
  }
  ref_cell[1].e2n = local_338;
  if ((4.0 < (double)ref_cell[1].e2n) && (0.4 < *(double *)&ref_cell[1].edge_per)) {
    *(double *)&ref_cell[1].edge_per =
         (4.0 / (double)ref_cell[1].e2n) * *(double *)&ref_cell[1].edge_per;
  }
  if ((((double)ref_cell[1].e2n <= 3.5 && (double)ref_cell[1].e2n != 3.5) &&
      (1.6 < (double)ref_cell[1].e2n)) && (0.4 < *(double *)&ref_cell[1].edge_per)) {
    *(double *)&ref_cell[1].edge_per =
         (1.4 / (double)ref_cell[1].e2n) * *(double *)&ref_cell[1].edge_per;
  }
  dVar7 = sqrt(2.0);
  *(double *)&ref_cell->size_per = dVar7;
  if ((ref_private_macro_code_rss_1 == 0) && (3.0 < _max_degree)) {
    dVar7 = sqrt(2.0);
    *(double *)&ref_cell->size_per = (dVar7 + (double)_part) * 0.5;
  }
  if ((double)ref_cell[1].f2n - *(double *)&ref_cell[1].edge_per <= 0.0) {
    local_340 = -((double)ref_cell[1].f2n - *(double *)&ref_cell[1].edge_per);
  }
  else {
    local_340 = (double)ref_cell[1].f2n - *(double *)&ref_cell[1].edge_per;
  }
  if (local_340 < *(double *)&ref_cell[1].edge_per * 0.01) {
    if (*(double *)&ref_cell[1].n - (double)ref_cell[1].e2n <= 0.0) {
      local_348 = -(*(double *)&ref_cell[1].n - (double)ref_cell[1].e2n);
    }
    else {
      local_348 = *(double *)&ref_cell[1].n - (double)ref_cell[1].e2n;
    }
    if ((local_348 < (double)ref_cell[1].e2n * 0.01) &&
       ((((int)(uint)ref_edge < 0x32 ||
         ((0.1 < *(double *)&ref_cell[1].edge_per &&
          ((double)ref_cell[1].e2n <= 3.0 && (double)ref_cell[1].e2n != 3.0)))) &&
        (*(double *)&ref_cell->size_per <= 1.5 && *(double *)&ref_cell->size_per != 1.5)))) {
      ref_mpi->n = 1;
      if (*(int *)(*(long *)all_done_local + 4) == 0) {
        printf("termination recommended\n");
      }
      goto LAB_001e8358;
    }
  }
  ref_mpi->n = 0;
LAB_001e8358:
  uVar6 = ref_mpi_bcast((REF_MPI)ref_node,ref_mpi,1,1);
  if (uVar6 == 0) {
    ref_cell[1].f2n = *(REF_INT **)&ref_cell[1].edge_per;
    *(REF_INT **)&ref_cell[1].n = ref_cell[1].e2n;
    if (*(int *)(*(long *)all_done_local + 4) == 0) {
      uVar1._0_4_ = ref_cell[1].size_per;
      uVar1._4_4_ = ref_cell[1].node_per;
      uVar2._0_4_ = ref_cell[1].edge_per;
      uVar2._4_4_ = ref_cell[1].face_per;
      uVar3._0_4_ = ref_cell->size_per;
      uVar3._4_4_ = ref_cell->node_per;
      printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",target_normdev,
             uVar1,uVar2,ref_cell[1].e2n,uVar3);
      printf("max degree %d max age %d normdev %7.4f\n",volume,(ulong)ratio._0_4_,
             (ulong)(uint)ref_edge);
      printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n",min_metric_vol,_max_degree,
             (ulong)nodes_per_complexity._4_4_,local_50);
      uVar4._0_4_ = ref_adapt->unlock_tet;
      uVar4._4_4_ = ref_adapt->timing_level;
      printf("volume range %e %e metric %e floor %e\n",target_quality,max_volume,quality,uVar4);
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x15c,
           "ref_adapt_parameter",(ulong)uVar6,"done");
    ref_grid_local._4_4_ = uVar6;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,
                                              REF_BOOL *all_done) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_ADAPT ref_adapt = ref_grid->adapt;
  REF_CELL ref_cell;
  REF_INT cell;
  REF_LONG ncell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL det, max_det, complexity, min_metric_vol;
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL volume, min_volume, max_volume;
  REF_DBL target_quality, target_normdev;
  REF_INT cell_node;
  REF_INT node, nnode;
  REF_DBL nodes_per_complexity;
  REF_INT degree, max_degree;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_INT edge, part;
  REF_INT age, max_age;
  REF_EDGE ref_edge;
  REF_DBL m[6];
  REF_INT int_mixed, local_mixed;
  REF_BOOL mixed;

  int_mixed = 0;
  if (ref_cell_n(ref_grid_qua(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_hex(ref_grid)) > 0)
    int_mixed = 1;
  local_mixed = int_mixed;
  RSS(ref_mpi_max(ref_mpi, &local_mixed, &int_mixed, REF_INT_TYPE), "mpi max");
  mixed = (int_mixed > 0);

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  min_volume = REF_DBL_MAX;
  max_volume = REF_DBL_MIN;
  max_det = -1.0;
  complexity = 0.0;
  ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &volume), "vol");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tet_vol(ref_grid_node(ref_grid), nodes, &volume), "vol");
    }
    min_quality = MIN(min_quality, quality);
    min_volume = MIN(min_volume, volume);
    max_volume = MAX(max_volume, volume);

    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_node_metric_get(ref_node, nodes[cell_node], m), "get");
        RSS(ref_matrix_det_m(m, &det), "det");
        max_det = MAX(max_det, det);
        if (ref_grid_surf(ref_grid)) {
          REF_DBL area, normal[3], normal_projection;
          RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &area), "vol");
          RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, normal),
              "norm");

          if (REF_SUCCESS == ref_math_normalize(normal)) {
            normal_projection = ref_matrix_vt_m_v(m, normal);
            if (ref_math_divisible(det, normal_projection)) {
              if (det / normal_projection > 0.0) {
                complexity += sqrt(det / normal_projection) * area /
                              ((REF_DBL)ref_cell_node_per(ref_cell));
              }
            }
          }
        } else {
          if (det > 0.0) {
            complexity +=
                sqrt(det) * volume / ((REF_DBL)ref_cell_node_per(ref_cell));
          }
        }
      }
    }
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part == ref_mpi_rank(ref_mpi)) ncell++;
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "mbast");
  volume = min_volume;
  RSS(ref_mpi_min(ref_mpi, &volume, &min_volume, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_volume, 1, REF_DBL_TYPE), "bcast");
  volume = max_volume;
  RSS(ref_mpi_max(ref_mpi, &volume, &max_volume, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_volume, 1, REF_DBL_TYPE), "bcast");
  det = max_det;
  RSS(ref_mpi_max(ref_mpi, &det, &max_det, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_det, 1, REF_DBL_TYPE), "bcast");
  RAS(ref_math_divisible(1.0, sqrt(max_det)), "can not invert sqrt(max_det)");
  min_metric_vol = 1.0 / sqrt(max_det);

  RSS(ref_mpi_allsum(ref_mpi, &complexity, 1, REF_DBL_TYPE), "dbl sum");
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "cell int sum");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  nodes_per_complexity = (REF_DBL)nnode / complexity;

  max_degree = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_adj_degree(ref_cell_adj(ref_cell), node, &degree), "cell degree");
    max_degree = MAX(max_degree, degree);
  }
  degree = max_degree;
  RSS(ref_mpi_max(ref_mpi, &degree, &max_degree, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_degree, 1, REF_INT_TYPE), "min");

  max_age = 0;
  each_ref_node_valid_node(ref_node, node) {
    max_age = MAX(max_age, ref_node_age(ref_node, node));
  }
  age = max_age;
  RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  target_normdev = MAX(MIN(0.1, min_normdev), 1.0e-3);
  ref_adapt->post_min_normdev = target_normdev;

  target_quality = MAX(MIN(0.1, min_quality), 1.0e-3);
  ref_adapt->collapse_quality_absolute = target_quality;
  ref_adapt->smooth_min_quality = target_quality;

  ref_node->min_volume = MIN(1.0e-15, 0.01 * min_metric_vol);

  /* allow edge growth when interpolating metric continuously */
  ref_adapt->split_ratio_growth = REF_FALSE;
  if (NULL != ref_grid_interp(ref_grid)) {
    ref_adapt->split_ratio_growth =
        ref_interp_continuously(ref_grid_interp(ref_grid));
  }

  /* bound ratio to current range */
  ref_adapt->post_min_ratio = MIN(min_ratio, ref_adapt->collapse_ratio);
  ref_adapt->post_max_ratio = MAX(max_ratio, ref_adapt->split_ratio);

  if (ref_adapt->post_max_ratio > 4.0 && ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (4.0 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  /* when close to convergence, prevent high lower limit from stopping split */
  if (ref_adapt->post_max_ratio < 3.5 && ref_adapt->post_max_ratio > 1.6 &&
      ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (1.4 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  ref_adapt->split_ratio = sqrt(2.0);
  /* prevent overshoot of number of nodes, unless unreliable due to mixed */
  if (!mixed && nodes_per_complexity > 3.0)
    ref_adapt->split_ratio = 0.5 * (sqrt(2.0) + max_ratio);

  if (ABS(ref_adapt->last_min_ratio - ref_adapt->post_min_ratio) <
          1e-2 * ref_adapt->post_min_ratio &&
      ABS(ref_adapt->last_max_ratio - ref_adapt->post_max_ratio) <
          1e-2 * ref_adapt->post_max_ratio &&
      (max_age < 50 ||
       (ref_adapt->post_min_ratio > 0.1 && ref_adapt->post_max_ratio < 3.0)) &&
      1.5 > ref_adapt->split_ratio) {
    *all_done = REF_TRUE;
    if (ref_grid_once(ref_grid)) {
      printf("termination recommended\n");
    }
  } else {
    *all_done = REF_FALSE;
  }
  RSS(ref_mpi_bcast(ref_mpi, all_done, 1, REF_INT_TYPE), "done");

  ref_adapt->last_min_ratio = ref_adapt->post_min_ratio;
  ref_adapt->last_max_ratio = ref_adapt->post_max_ratio;

  if (ref_grid_once(ref_grid)) {
    printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",
           target_quality, ref_adapt->post_min_normdev,
           ref_adapt->post_min_ratio, ref_adapt->post_max_ratio,
           ref_adapt->split_ratio);
    printf("max degree %d max age %d normdev %7.4f\n", max_degree, max_age,
           min_normdev);
    printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n", nnode,
           ncell, complexity, nodes_per_complexity);
    printf("volume range %e %e metric %e floor %e\n", max_volume, min_volume,
           min_metric_vol, ref_node->min_volume);
  }

  return REF_SUCCESS;
}